

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O0

void Dch_ObjAddClass(Dch_Cla_t *p,Aig_Obj_t *pRepr,Aig_Obj_t **pClass,int nSize)

{
  int nSize_local;
  Aig_Obj_t **pClass_local;
  Aig_Obj_t *pRepr_local;
  Dch_Cla_t *p_local;
  
  if (p->pId2Class[pRepr->Id] != (Aig_Obj_t **)0x0) {
    __assert_fail("p->pId2Class[pRepr->Id] == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                  ,0x5c,"void Dch_ObjAddClass(Dch_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
  }
  p->pId2Class[pRepr->Id] = pClass;
  if (p->pClassSizes[pRepr->Id] == 0) {
    if (1 < nSize) {
      p->pClassSizes[pRepr->Id] = nSize;
      p->nClasses = p->nClasses + 1;
      p->nLits = nSize + -1 + p->nLits;
      return;
    }
    __assert_fail("nSize > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                  ,0x5f,"void Dch_ObjAddClass(Dch_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
  }
  __assert_fail("p->pClassSizes[pRepr->Id] == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                ,0x5e,"void Dch_ObjAddClass(Dch_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
}

Assistant:

static inline void Dch_ObjAddClass( Dch_Cla_t * p, Aig_Obj_t * pRepr, Aig_Obj_t ** pClass, int nSize ) 
{
    assert( p->pId2Class[pRepr->Id] == NULL );
    p->pId2Class[pRepr->Id] = pClass; 
    assert( p->pClassSizes[pRepr->Id] == 0 );
    assert( nSize > 1 );
    p->pClassSizes[pRepr->Id] = nSize;
    p->nClasses++;
    p->nLits += nSize - 1;
}